

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::WriteLinearOffsets
          (BamStandardIndex *this,int *refId,BaiLinearOffsetVector *linearOffsets)

{
  IBamIODevice *pIVar1;
  ulong *puVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BamException *this_00;
  ulong *puVar4;
  long lVar5;
  allocator local_7e;
  allocator local_7d;
  int32_t offsetCount;
  BaiLinearOffsetVector *local_78;
  uint64_t linearOffset;
  string local_50;
  
  SortLinearOffsets(this,linearOffsets);
  offsetCount = (int32_t)((ulong)((long)(linearOffsets->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(linearOffsets->
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (this->m_isBigEndian == true) {
    SwapEndian_32(&offsetCount);
  }
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&offsetCount,4);
  lVar5 = CONCAT44(extraout_var,iVar3);
  linearOffset = CONCAT44(linearOffset._4_4_,
                          (int)((ulong)((long)(linearOffsets->
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(linearOffsets->
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             )._M_impl.super__Vector_impl_data._M_start) >> 3));
  SaveLinearOffsetsSummary(this,refId,(int *)&linearOffset);
  puVar2 = (linearOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_78 = linearOffsets;
  for (puVar4 = (linearOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    linearOffset = *puVar4;
    if (this->m_isBigEndian == true) {
      linearOffset = linearOffset >> 0x38 | (linearOffset & 0xff000000000000) >> 0x28 |
                     (linearOffset & 0xff0000000000) >> 0x18 | (linearOffset & 0xff00000000) >> 8 |
                     (linearOffset & 0xff000000) << 8 | (linearOffset & 0xff0000) << 0x18 |
                     (linearOffset & 0xff00) << 0x28 | linearOffset << 0x38;
    }
    pIVar1 = (this->m_resources).Device;
    iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&linearOffset,8);
    lVar5 = lVar5 + CONCAT44(extraout_var_00,iVar3);
  }
  if (lVar5 == (long)(local_78->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish +
               (4 - (long)(local_78->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start)) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&linearOffset,"BamStandardIndex::WriteLinearOffsets",&local_7d);
  std::__cxx11::string::string((string *)&local_50,"could not write BAI linear offsets",&local_7e);
  BamException::BamException(this_00,(string *)&linearOffset,&local_50);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::WriteLinearOffsets(const int& refId, BaiLinearOffsetVector& linearOffsets)
{

    // make sure linear offsets are sorted before writing & saving summary
    SortLinearOffsets(linearOffsets);

    int64_t numBytesWritten = 0;

    // write number of linear offsets
    int32_t offsetCount = linearOffsets.size();
    if (m_isBigEndian) SwapEndian_32(offsetCount);
    numBytesWritten += m_resources.Device->Write((const char*)&offsetCount, sizeof(offsetCount));

    // save summary for reference's linear offsets
    SaveLinearOffsetsSummary(refId, linearOffsets.size());

    // iterate over linear offsets
    BaiLinearOffsetVector::const_iterator offsetIter = linearOffsets.begin();
    BaiLinearOffsetVector::const_iterator offsetEnd = linearOffsets.end();
    for (; offsetIter != offsetEnd; ++offsetIter) {

        // write linear offset
        uint64_t linearOffset = (*offsetIter);
        if (m_isBigEndian) SwapEndian_64(linearOffset);
        numBytesWritten +=
            m_resources.Device->Write((const char*)&linearOffset, sizeof(linearOffset));
    }

    if (numBytesWritten !=
        static_cast<int64_t>(sizeof(offsetCount) + linearOffsets.size() * sizeof(uint64_t)))
        throw BamException("BamStandardIndex::WriteLinearOffsets",
                           "could not write BAI linear offsets");
}